

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LagrangePolynomial.cpp
# Opt level: O1

int64_t __thiscall
LagrangePolynomial::find_product(LagrangePolynomial *this,vector<int,_std::allocator<int>_> *data)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  piVar1 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    lVar2 = 1;
    lVar4 = 0;
    do {
      lVar2 = lVar2 * piVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    return lVar2;
  }
  return 1;
}

Assistant:

int64_t LagrangePolynomial::find_product(vector<int> data) {
    // returns product of vector<int> data
    // used to find the product of all denominators of the basis polynomial
    int64_t  result = 1;

    for(int i=0; i<data.size(); i++){
        result = result * data[i];
    }
    return result;
}